

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::SimpleNode::AnnotatePass1
          (SimpleNode *this,Compiler *compiler,bool parentNotInLoop,bool parentAtLeastOnce,
          bool parentNotSpeculative,bool parentNotNegated)

{
  NodeTag NVar1;
  code *pcVar2;
  bool bVar3;
  CharSet<char16_t> *pCVar4;
  undefined4 *puVar5;
  bool parentNotNegated_local;
  bool parentNotSpeculative_local;
  bool parentAtLeastOnce_local;
  bool parentNotInLoop_local;
  Compiler *compiler_local;
  SimpleNode *this_local;
  
  *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xfffffffe;
  CountDomain::Exact(&(this->super_Node).thisConsumes,0);
  (this->super_Node).field_0xc = (this->super_Node).field_0xc | 0x10;
  (this->super_Node).field_0xc = (this->super_Node).field_0xc | 0x20;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffffbff | (parentNotInLoop & 1) << 10;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffff7ff | (parentAtLeastOnce & 1) << 0xb;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffefff | (parentNotSpeculative & 1) << 0xc;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffdfff | (parentNotNegated & 1) << 0xd;
  NVar1 = (this->super_Node).tag;
  if (NVar1 == Empty) {
    (this->super_Node).features = 1;
    pCVar4 = StandardChars<char16_t>::GetEmptySet(compiler->standardChars);
    (this->super_Node).firstSet = pCVar4;
    *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xfffffffd | 2
    ;
  }
  else if (NVar1 == BOL) {
    (this->super_Node).features = 2;
    pCVar4 = StandardChars<char16_t>::GetFullSet(compiler->standardChars);
    (this->super_Node).firstSet = pCVar4;
    *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xfffffffd;
  }
  else if (NVar1 == EOL) {
    (this->super_Node).features = 4;
    if ((compiler->program->flags & MultilineRegexFlag) == NoRegexFlags) {
      pCVar4 = StandardChars<char16_t>::GetEmptySet(compiler->standardChars);
      (this->super_Node).firstSet = pCVar4;
    }
    else {
      pCVar4 = StandardChars<char16_t>::GetNewlineSet(compiler->standardChars);
      (this->super_Node).firstSet = pCVar4;
    }
    *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xfffffffd;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x1ae,"(false)","false");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  return;
}

Assistant:

void SimpleNode::AnnotatePass1(Compiler& compiler, bool parentNotInLoop, bool parentAtLeastOnce, bool parentNotSpeculative, bool parentNotNegated)
    {
        isFirstExact = false;
        thisConsumes.Exact(0);
        isThisWillNotProgress = true;
        isThisWillNotRegress = true;
        isNotInLoop = parentNotInLoop;
        isAtLeastOnce = parentAtLeastOnce;
        isNotSpeculative = parentNotSpeculative;
        isNotNegated = parentNotNegated;
        switch (tag)
        {
        case Empty:
            features = HasEmpty;
            firstSet = compiler.standardChars->GetEmptySet();
            isThisIrrefutable = true;
            break;
        case BOL:
            features = HasBOL;
            firstSet = compiler.standardChars->GetFullSet();
            isThisIrrefutable = false;
            break;
        case EOL:
            features = HasEOL;
            if ((compiler.program->flags & MultilineRegexFlag) != 0)
                firstSet = compiler.standardChars->GetNewlineSet();
            else
                firstSet = compiler.standardChars->GetEmptySet();
            isThisIrrefutable = false;
            break;
        default:
            Assert(false);
        }
    }